

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

void provide_xrm_string(char *string,char *progname)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  byte *s;
  byte *__src;
  undefined8 *e;
  void *pvVar4;
  ushort **ppuVar5;
  char *pcVar6;
  size_t factor1;
  
  s = (byte *)strchr(string,0x3a);
  if (s == (byte *)0x0) {
    fprintf(_stderr,"%s: expected a colon in resource string \"%s\"\n",progname,string);
    return;
  }
  pbVar2 = s;
  sVar3 = 1;
  do {
    factor1 = sVar3;
    __src = pbVar2;
    if (__src <= string) break;
    pbVar2 = __src + -1;
    sVar3 = factor1 + 1;
  } while ((__src[-1] | 4) != 0x2e);
  e = (undefined8 *)safemalloc(1,0x10,0);
  pvVar4 = safemalloc(factor1,1,0);
  memcpy(pvVar4,__src,factor1);
  *(undefined1 *)((long)pvVar4 + (factor1 - 1)) = 0;
  *e = pvVar4;
  do {
    s = s + 1;
    bVar1 = *s;
    if ((ulong)bVar1 == 0) break;
    ppuVar5 = __ctype_b_loc();
  } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
  pcVar6 = dupstr((char *)s);
  e[1] = pcVar6;
  if (xrmtree == (tree234 *)0x0) {
    xrmtree = newtree234(keycmp);
  }
  pvVar4 = add234(xrmtree,e);
  if (pvVar4 == (void *)0x0) {
    return;
  }
  del234(xrmtree,pvVar4);
  add234(xrmtree,e);
  return;
}

Assistant:

void provide_xrm_string(const char *string, const char *progname)
{
    const char *p, *q;
    char *key;
    struct skeyval *xrms, *ret;

    p = q = strchr(string, ':');
    if (!q) {
        fprintf(stderr, "%s: expected a colon in resource string"
                " \"%s\"\n", progname, string);
        return;
    }
    q++;
    while (p > string && p[-1] != '.' && p[-1] != '*')
        p--;
    xrms = snew(struct skeyval);
    key = snewn(q-p, char);
    memcpy(key, p, q-p);
    key[q-p-1] = '\0';
    xrms->key = key;
    while (*q && isspace((unsigned char)*q))
        q++;
    xrms->value = dupstr(q);

    if (!xrmtree)
        xrmtree = newtree234(keycmp);

    ret = add234(xrmtree, xrms);
    if (ret) {
        /* Override an existing string. */
        del234(xrmtree, ret);
        add234(xrmtree, xrms);
    }
}